

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void lua_replace(lua_State *L,int idx)

{
  StkId pTVar1;
  global_State *g;
  TValue *pTVar2;
  GCObject *pGVar3;
  GCObject *o;
  
  if ((idx == -0x2711) && (L->ci == L->base_ci)) {
    luaG_runerror(L,"no calling environment");
  }
  pTVar2 = index2adr(L,idx);
  if (idx == -0x2711) {
    pGVar3 = (L->ci->func->value).gc;
    (pGVar3->h).array = (TValue *)L->top[-1].value;
    if ((L->top[-1].tt < 4) || (o = L->top[-1].value.gc, ((o->gch).marked & 3) == 0))
    goto LAB_00110bc2;
  }
  else {
    pTVar1 = L->top;
    pTVar2->value = pTVar1[-1].value;
    pTVar2->tt = pTVar1[-1].tt;
    if (((-0x2713 < idx) || (L->top[-1].tt < 4)) ||
       (o = L->top[-1].value.gc, ((o->gch).marked & 3) == 0)) goto LAB_00110bc2;
    pGVar3 = (L->ci->func->value).gc;
  }
  if (((pGVar3->gch).marked & 4) != 0) {
    g = L->l_G;
    if (g->gcstate == '\x01') {
      reallymarkobject(g,o);
    }
    else {
      (pGVar3->gch).marked = g->currentwhite & 3 | (pGVar3->gch).marked & 0xf8;
    }
  }
LAB_00110bc2:
  L->top = L->top + -1;
  return;
}

Assistant:

static void lua_replace(lua_State*L,int idx){
StkId o;
if(idx==(-10001)&&L->ci==L->base_ci)
luaG_runerror(L,"no calling environment");
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
if(idx==(-10001)){
Closure*func=curr_func(L);
luai_apicheck(L,ttistable(L->top-1));
func->c.env=hvalue(L->top-1);
luaC_barrier(L,func,L->top-1);
}
else{
setobj(L,o,L->top-1);
if(idx<(-10002))
luaC_barrier(L,curr_func(L),L->top-1);
}
L->top--;
}